

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign_extension.c
# Opt level: O2

uint32_t sign_extend_word(uint32_t v,int old,int new)

{
  uint uVar1;
  
  if (old <= new) {
    uVar1 = 1 << ((char)old - 1U & 0x1f) & v;
    return (v ^ uVar1) - uVar1;
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/sign_extension.c"
          ,0x13);
  fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
          "Can\'t downsize signed values with this function!");
  exit(1);
}

Assistant:

word sign_extend_word(word v, int old, int new) {
    unimplemented(new < old, "Can't downsize signed values with this function!")

    word mask = v & (1 << (old - 1));
    bool s = mask > 0;
    if (s) {
        return (v ^ mask) - mask;
    }
    else {
        return v; // No sign bit set, don't need to sign extend
    }
}